

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O0

void __thiscall
cmExportFileGenerator::GenerateImportVersionCode(cmExportFileGenerator *this,ostream *os)

{
  ostream *poVar1;
  ostream *os_local;
  cmExportFileGenerator *this_local;
  
  poVar1 = std::operator<<(os,"# Commands may need to know the format version.\n");
  poVar1 = std::operator<<(poVar1,"set(CMAKE_IMPORT_FILE_VERSION 1)\n");
  std::operator<<(poVar1,"\n");
  return;
}

Assistant:

void cmExportFileGenerator::GenerateImportVersionCode(std::ostream& os)
{
  // Store an import file format version.  This will let us change the
  // format later while still allowing old import files to work.
  /* clang-format off */
  os << "# Commands may need to know the format version.\n"
     << "set(CMAKE_IMPORT_FILE_VERSION 1)\n"
     << "\n";
  /* clang-format on */
}